

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O1

void read_rle_pixel(tga_source_ptr sinfo)

{
  j_compress_ptr pjVar1;
  jpeg_error_mgr *pjVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  if (sinfo->dup_pixel_count < 1) {
    iVar4 = sinfo->block_count;
    sinfo->block_count = iVar4 + -1;
    if (iVar4 < 1) {
      uVar3 = getc((FILE *)(sinfo->pub).input_file);
      if (uVar3 == 0xffffffff) {
        pjVar1 = sinfo->cinfo;
        pjVar2 = pjVar1->err;
        pjVar2->msg_code = 0x2b;
        (*pjVar2->error_exit)((j_common_ptr)pjVar1);
      }
      uVar5 = uVar3 & 0x7f;
      if ((char)uVar3 < '\0') {
        sinfo->dup_pixel_count = uVar5;
        uVar5 = 0;
      }
      sinfo->block_count = uVar5;
    }
    if (0 < sinfo->pixel_size) {
      lVar6 = 0;
      do {
        iVar4 = getc((FILE *)(sinfo->pub).input_file);
        if (iVar4 == -1) {
          pjVar1 = sinfo->cinfo;
          pjVar2 = pjVar1->err;
          pjVar2->msg_code = 0x2b;
          (*pjVar2->error_exit)((j_common_ptr)pjVar1);
        }
        sinfo->tga_pixel[lVar6] = (U_CHAR)iVar4;
        lVar6 = lVar6 + 1;
      } while (lVar6 < sinfo->pixel_size);
    }
  }
  else {
    sinfo->dup_pixel_count = sinfo->dup_pixel_count + -1;
  }
  return;
}

Assistant:

METHODDEF(void)
read_rle_pixel(tga_source_ptr sinfo)
/* Read one Targa pixel from the input file, expanding RLE data as needed */
{
  register int i;

  /* Duplicate previously read pixel? */
  if (sinfo->dup_pixel_count > 0) {
    sinfo->dup_pixel_count--;
    return;
  }

  /* Time to read RLE block header? */
  if (--sinfo->block_count < 0) { /* decrement pixels remaining in block */
    i = read_byte(sinfo);
    if (i & 0x80) {             /* Start of duplicate-pixel block? */
      sinfo->dup_pixel_count = i & 0x7F; /* number of dups after this one */
      sinfo->block_count = 0;   /* then read new block header */
    } else {
      sinfo->block_count = i & 0x7F; /* number of pixels after this one */
    }
  }

  /* Read next pixel */
  for (i = 0; i < sinfo->pixel_size; i++) {
    sinfo->tga_pixel[i] = (U_CHAR)read_byte(sinfo);
  }
}